

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

int av1_get_sbq_user_rating_based(AV1_COMP *cpi,int mi_row,int mi_col)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = (cpi->common).quant_params.base_qindex;
  if ((iVar4 != 0) && (iVar4 != 0xff)) {
    BVar1 = ((cpi->common).seq_params)->sb_size;
    bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
    iVar4 = iVar4 + cpi->mb_delta_q
                    [mi_col / (int)(uint)bVar2 +
                     (mi_row / (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                          [BVar1]) *
                     ((int)((cpi->common).mi_params.mi_cols + (uint)bVar2 + -1) / (int)(uint)bVar2)]
    ;
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    iVar3 = 1;
    if (1 < iVar4) {
      iVar3 = iVar4;
    }
    return iVar3;
  }
  return iVar4;
}

Assistant:

int av1_get_sbq_user_rating_based(const AV1_COMP *const cpi, int mi_row,
                                  int mi_col) {
  const BLOCK_SIZE bsize = cpi->common.seq_params->sb_size;
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  if (base_qindex == MINQ || base_qindex == MAXQ) return base_qindex;

  const int num_mi_w = mi_size_wide[bsize];
  const int num_mi_h = mi_size_high[bsize];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int index = (mi_row / num_mi_h) * num_cols + (mi_col / num_mi_w);
  const int delta_q = cpi->mb_delta_q[index];

  int qindex = base_qindex + delta_q;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ + 1);

  return qindex;
}